

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_0::recordSinglePrimaryBufferTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkDevice *ppVVar1;
  VkEvent obj;
  VkResult VVar2;
  VkDevice device;
  DeviceInterface *vk;
  Unique<vk::VkCommandBuffer_s_*> primCmdBuf;
  VkCommandBufferBeginInfo primCmdBufBeginInfo;
  Unique<vk::Handle<(vk::HandleType)10>_> event;
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  VkCommandBufferAllocateInfo cmdBufParams;
  VkCommandPoolCreateInfo cmdPoolParams;
  Move<vk::Handle<(vk::HandleType)10>_> local_108;
  VkCommandBuffer_s *local_e8;
  DeviceInterface *pDStack_e0;
  VkDevice local_d8;
  deUint64 dStack_d0;
  Move<vk::VkCommandBuffer_s_*> local_c8;
  undefined4 local_a8;
  undefined4 uStack_a4;
  Deleter<vk::Handle<(vk::HandleType)10>_> DStack_a0;
  VkCommandPool local_88;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_80;
  undefined1 local_68 [24];
  VkAllocationCallbacks *pVStack_50;
  VkCommandPoolCreateInfo local_40;
  
  device = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  local_40.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_40.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  local_40.pNext = (void *)0x0;
  local_40.flags = 2;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)local_68,vk,device,&local_40,
             (VkAllocationCallbacks *)0x0);
  local_88.m_internal = CONCAT44(local_68._4_4_,local_68._0_4_);
  DStack_80.m_device = (VkDevice)local_68._16_8_;
  DStack_80.m_allocator = pVStack_50;
  DStack_80.m_deviceIface = (DeviceInterface *)local_68._8_8_;
  local_68._0_4_ = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  local_68._8_8_ = (DeviceInterface *)0x0;
  pVStack_50 = (VkAllocationCallbacks *)0x100000000;
  ::vk::allocateCommandBuffer(&local_c8,vk,device,(VkCommandBufferAllocateInfo *)local_68);
  local_d8 = local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device;
  dStack_d0 = local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal;
  local_e8 = local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  pDStack_e0 = local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface;
  local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device = (VkDevice)0x0;
  local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal = 0;
  local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object = (VkCommandBuffer_s *)0x2a;
  local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  ::vk::createEvent(&local_108,vk,device,0,(VkAllocationCallbacks *)0x0);
  DStack_a0.m_device._0_4_ =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device._0_4_;
  DStack_a0.m_device._4_4_ =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device._4_4_;
  DStack_a0.m_allocator._0_4_ =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator._0_4_;
  DStack_a0.m_allocator._4_4_ =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator._4_4_;
  local_a8 = (undefined4)
             local_108.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal;
  uStack_a4 = local_108.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal.
              _4_4_;
  DStack_a0.m_deviceIface._0_4_ =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_deviceIface._0_4_;
  DStack_a0.m_deviceIface._4_4_ =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_deviceIface._4_4_;
  VVar2 = (*vk->_vptr_DeviceInterface[0x49])(vk,local_e8,&local_c8);
  ::vk::checkResult(VVar2,"vk.beginCommandBuffer(*primCmdBuf, &primCmdBufBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x544);
  (*vk->_vptr_DeviceInterface[0x6a])(vk,local_e8,CONCAT44(uStack_a4,local_a8),0x10000);
  VVar2 = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_e8);
  ::vk::checkResult(VVar2,"vk.endCommandBuffer(*primCmdBuf)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x549);
  ppVVar1 = &local_108.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device;
  local_108.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal =
       (deUint64)ppVVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,"Primary buffer recorded successfully.","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,
             local_108.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal,
             (undefined1 *)
             (CONCAT44(local_108.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                       m_deviceIface._4_4_,
                       local_108.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                       m_deviceIface._0_4_) +
             local_108.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal));
  if ((VkDevice *)local_108.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal
      != ppVVar1) {
    operator_delete((void *)local_108.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.
                            m_internal,
                    CONCAT44(local_108.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter
                             .m_device._4_4_,
                             local_108.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter
                             .m_device._0_4_) + 1);
  }
  obj.m_internal._4_4_ = uStack_a4;
  obj.m_internal._0_4_ = local_a8;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)10>_>::operator()(&DStack_a0,obj);
  }
  if (local_e8 != (VkCommandBuffer_s *)0x0) {
    local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object = local_e8;
    (*pDStack_e0->_vptr_DeviceInterface[0x48])(pDStack_e0,local_d8,dStack_d0,1);
  }
  if (local_88.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_80,local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus recordSinglePrimaryBufferTest(Context& context)
{
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					//	VkStructureType				sType;
		DE_NULL,													//	const void*					pNext;
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			//	VkCommandPoolCreateFlags	flags;
		queueFamilyIndex,											//	deUint32					queueFamilyIndex;
	};
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams));

	// Command buffer
	const VkCommandBufferAllocateInfo		cmdBufParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,				//	VkStructureType				sType;
		DE_NULL,													//	const void*					pNext;
		*cmdPool,													//	VkCommandPool				pool;
		VK_COMMAND_BUFFER_LEVEL_PRIMARY,							//	VkCommandBufferLevel		level;
		1u,															//	uint32_t					bufferCount;
	};
	const Unique<VkCommandBuffer>			primCmdBuf				(allocateCommandBuffer(vk, vkDevice, &cmdBufParams));

	const VkCommandBufferBeginInfo			primCmdBufBeginInfo		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,
		DE_NULL,
		0,															// flags
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	// create event that will be used to check if secondary command buffer has been executed
	const Unique<VkEvent>					event					(createEvent(vk, vkDevice));

	// record primary command buffer
	VK_CHECK(vk.beginCommandBuffer(*primCmdBuf, &primCmdBufBeginInfo));
	{
		// record setting event
		vk.cmdSetEvent(*primCmdBuf, *event, VK_PIPELINE_STAGE_ALL_COMMANDS_BIT);
	}
	VK_CHECK(vk.endCommandBuffer(*primCmdBuf));

	return tcu::TestStatus::pass("Primary buffer recorded successfully.");
}